

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQuerySpecification.cpp
# Opt level: O1

void __thiscall
DIS::RecordQuerySpecification::marshal(RecordQuerySpecification *this,DataStream *dataStream)

{
  pointer pFVar1;
  long lVar2;
  ulong uVar3;
  FourByteChunk x;
  FourByteChunk local_40;
  
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_records).
                                  super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_records).
                                 super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  pFVar1 = (this->_records).
           super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_records).super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar1) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      local_40._vptr_FourByteChunk = (_func_int **)&PTR__FourByteChunk_001b4cb0;
      local_40._otherParameters = *(char (*) [4])(pFVar1->_otherParameters + lVar2 + -8);
      FourByteChunk::marshal(&local_40,dataStream);
      FourByteChunk::~FourByteChunk(&local_40);
      uVar3 = uVar3 + 1;
      pFVar1 = (this->_records).
               super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < (ulong)((long)(this->_records).
                                   super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4));
  }
  return;
}

Assistant:

void RecordQuerySpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_records.size();

     for(size_t idx = 0; idx < _records.size(); idx++)
     {
        FourByteChunk x = _records[idx];
        x.marshal(dataStream);
     }

}